

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_query_tests.cpp
# Opt level: O2

void __thiscall
QueryTests_SelectDataSetWithCriteria_canDetermineSpecificationForSelectDataSetWithCriteria_Test::
TestBody(QueryTests_SelectDataSetWithCriteria_canDetermineSpecificationForSelectDataSetWithCriteria_Test
         *this)

{
  size_type *psVar1;
  bool bVar2;
  long lVar3;
  char *in_R9;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
  __l_00;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
  __l_03;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
  __l_04;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>
  __l_07;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>
  __l_08;
  allocator_type local_4f3;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_4f2;
  allocator_type local_4f1;
  AssertionResult gtest_ar__11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expected_dataset3;
  AssertionResult gtest_ar__5;
  string local_480 [8];
  undefined1 local_478 [56];
  AssertHelper local_440;
  api_filter_type filter3;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
  local_408;
  api_filter_type filter2;
  ComparisonType local_3bc;
  Query query_select_dataset_with_criteria3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expected_dataset2;
  Query query_select_dataset_with_criteria2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expected_dataset1;
  api_filter_type filter1;
  Query query_select_dataset_with_criteria1;
  
  database::Query::Query
            (&query_select_dataset_with_criteria1,
             "select employee_id,employee_name from company.employee where employee_id = 1");
  query_select_dataset_with_criteria3.m_query_string._M_string_length = 0;
  query_select_dataset_with_criteria3.m_query_string._M_dataplus._M_p._0_1_ =
       query_select_dataset_with_criteria1.m_transaction_metatype == dml;
  if ((bool)(char)query_select_dataset_with_criteria3.m_query_string._M_dataplus._M_p) {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&query_select_dataset_with_criteria3.m_query_string._M_string_length);
    std::__cxx11::string::string
              ((string *)&query_select_dataset_with_criteria2,
               (string *)&query_select_dataset_with_criteria1.m_database_name);
    query_select_dataset_with_criteria3.m_query_string._M_dataplus._M_p._0_1_ =
         std::operator==(&query_select_dataset_with_criteria2.m_query_string,"company");
    query_select_dataset_with_criteria3.m_query_string._M_string_length = 0;
    std::__cxx11::string::~string((string *)&query_select_dataset_with_criteria2);
    if ((char)query_select_dataset_with_criteria3.m_query_string._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&gtest_ar__5);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&query_select_dataset_with_criteria2.m_query_string,
                 (internal *)&query_select_dataset_with_criteria3,
                 (AssertionResult *)
                 "query_select_dataset_with_criteria1.databaseName() == \"company\"","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__11,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                 ,0x87,query_select_dataset_with_criteria2.m_query_string._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar__11,(Message *)&gtest_ar__5);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&query_select_dataset_with_criteria3.m_query_string._M_string_length);
      std::__cxx11::string::string
                ((string *)&query_select_dataset_with_criteria2,
                 (string *)&query_select_dataset_with_criteria1.m_container_name);
      query_select_dataset_with_criteria3.m_query_string._M_dataplus._M_p._0_1_ =
           std::operator==(&query_select_dataset_with_criteria2.m_query_string,"employee");
      query_select_dataset_with_criteria3.m_query_string._M_string_length = 0;
      std::__cxx11::string::~string((string *)&query_select_dataset_with_criteria2);
      if ((char)query_select_dataset_with_criteria3.m_query_string._M_dataplus._M_p != '\0') {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&query_select_dataset_with_criteria3.m_query_string._M_string_length);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&query_select_dataset_with_criteria2,"employee_id",
                   (allocator<char> *)&query_select_dataset_with_criteria3);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&query_select_dataset_with_criteria2.m_transaction_metatype,
                   "employee_name",(allocator<char> *)&gtest_ar__5);
        __l._M_len = 2;
        __l._M_array = &query_select_dataset_with_criteria2.m_query_string;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&expected_dataset1,__l,(allocator_type *)&gtest_ar__11);
        lVar3 = 0x20;
        do {
          std::__cxx11::string::~string
                    ((string *)
                     ((long)&query_select_dataset_with_criteria2.m_query_string._M_dataplus._M_p +
                     lVar3));
          lVar3 = lVar3 + -0x20;
        } while (lVar3 != -0x20);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&query_select_dataset_with_criteria2,
                 &query_select_dataset_with_criteria1.m_dataset);
        query_select_dataset_with_criteria3.m_query_string._M_dataplus._M_p._0_1_ =
             std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&query_select_dataset_with_criteria2,&expected_dataset1);
        psVar1 = &query_select_dataset_with_criteria3.m_query_string._M_string_length;
        query_select_dataset_with_criteria3.m_query_string._M_string_length = 0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&query_select_dataset_with_criteria2);
        if ((char)query_select_dataset_with_criteria3.m_query_string._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&gtest_ar__5);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&query_select_dataset_with_criteria2.m_query_string,
                     (internal *)&query_select_dataset_with_criteria3,
                     (AssertionResult *)
                     "query_select_dataset_with_criteria1.dataset() == expected_dataset1","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__11,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                     ,0x8a,query_select_dataset_with_criteria2.m_query_string._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__11,(Message *)&gtest_ar__5);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__11);
          std::__cxx11::string::~string((string *)&query_select_dataset_with_criteria2);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar__5);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)psVar1);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)psVar1);
          gtest_ar__11.success_ = false;
          gtest_ar__11._1_3_ = 0;
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
          ::pair<const_char_(&)[2],_database::ComparisonType,_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
                      *)&query_select_dataset_with_criteria3,(char (*) [2])0x130252,
                     (ComparisonType *)&gtest_ar__11);
          __l_00._M_len = 1;
          __l_00._M_array = (iterator)&query_select_dataset_with_criteria3;
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
          ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                    *)&gtest_ar__5,__l_00,(allocator_type *)&filter2);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
          ::pair<const_char_(&)[12],_true>
                    ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
                      *)&query_select_dataset_with_criteria2,(char (*) [12])"employee_id",
                     (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                      *)&gtest_ar__5);
          __l_01._M_len = 1;
          __l_01._M_array = (iterator)&query_select_dataset_with_criteria2;
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
          ::map(&filter1,__l_01,
                (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&filter3,(allocator_type *)&expected_dataset2);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
          ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
                   *)&query_select_dataset_with_criteria2);
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
          ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                     *)&gtest_ar__5);
          std::__cxx11::string::~string((string *)&query_select_dataset_with_criteria3);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
          ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                      *)&query_select_dataset_with_criteria2,
                     &query_select_dataset_with_criteria1.m_filter._M_t);
          query_select_dataset_with_criteria3.m_query_string._M_dataplus._M_p._0_1_ =
               std::operator==((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                                *)&query_select_dataset_with_criteria2,&filter1._M_t);
          psVar1 = &query_select_dataset_with_criteria3.m_query_string._M_string_length;
          query_select_dataset_with_criteria3.m_query_string._M_string_length = 0;
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                       *)&query_select_dataset_with_criteria2);
          if ((char)query_select_dataset_with_criteria3.m_query_string._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&gtest_ar__5);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&query_select_dataset_with_criteria2.m_query_string,
                       (internal *)&query_select_dataset_with_criteria3,
                       (AssertionResult *)"query_select_dataset_with_criteria1.filter() == filter1",
                       "false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar__11,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                       ,0x8e,query_select_dataset_with_criteria2.m_query_string._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar__11,(Message *)&gtest_ar__5);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__11);
            std::__cxx11::string::~string((string *)&query_select_dataset_with_criteria2);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar__5);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)psVar1);
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)psVar1);
            database::Query::Query
                      (&query_select_dataset_with_criteria2,
                       "select employee_name from company.employee where employee_status = fulltime and employee_department <> sales"
                      );
            gtest_ar__5.message_.ptr_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            gtest_ar__5.success_ =
                 query_select_dataset_with_criteria2.m_transaction_type == select_dataset;
            if (gtest_ar__5.success_) {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar__5.message_);
              gtest_ar__5.message_.ptr_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              gtest_ar__5.success_ =
                   query_select_dataset_with_criteria2.m_transaction_metatype == dml;
              if (!gtest_ar__5.success_) {
                testing::Message::Message((Message *)&gtest_ar__11);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&query_select_dataset_with_criteria3.m_query_string,
                           (internal *)&gtest_ar__5,
                           (AssertionResult *)
                           "query_select_dataset_with_criteria2.transactionMetaType() == database::dml"
                           ,"false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&filter2,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                           ,0x92,(char *)CONCAT71(query_select_dataset_with_criteria3.m_query_string
                                                  ._M_dataplus._M_p._1_7_,
                                                  (char)query_select_dataset_with_criteria3.
                                                        m_query_string._M_dataplus._M_p));
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&filter2,(Message *)&gtest_ar__11);
                goto LAB_00110df5;
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar__5.message_);
              std::__cxx11::string::string
                        ((string *)&query_select_dataset_with_criteria3,
                         (string *)&query_select_dataset_with_criteria2.m_database_name);
              gtest_ar__5.success_ =
                   std::operator==(&query_select_dataset_with_criteria3.m_query_string,"company");
              gtest_ar__5.message_.ptr_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              std::__cxx11::string::~string((string *)&query_select_dataset_with_criteria3);
              if (gtest_ar__5.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar__11);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&query_select_dataset_with_criteria3.m_query_string,
                           (internal *)&gtest_ar__5,
                           (AssertionResult *)
                           "query_select_dataset_with_criteria2.databaseName() == \"company\"",
                           "false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&filter2,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                           ,0x93,(char *)CONCAT71(query_select_dataset_with_criteria3.m_query_string
                                                  ._M_dataplus._M_p._1_7_,
                                                  (char)query_select_dataset_with_criteria3.
                                                        m_query_string._M_dataplus._M_p));
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&filter2,(Message *)&gtest_ar__11);
                goto LAB_00110df5;
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar__5.message_);
              std::__cxx11::string::string
                        ((string *)&query_select_dataset_with_criteria3,
                         (string *)&query_select_dataset_with_criteria2.m_container_name);
              gtest_ar__5.success_ =
                   std::operator==(&query_select_dataset_with_criteria3.m_query_string,"employee");
              gtest_ar__5.message_.ptr_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              std::__cxx11::string::~string((string *)&query_select_dataset_with_criteria3);
              if (gtest_ar__5.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar__11);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&query_select_dataset_with_criteria3.m_query_string,
                           (internal *)&gtest_ar__5,
                           (AssertionResult *)
                           "query_select_dataset_with_criteria2.containerName() == \"employee\"",
                           "false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&filter2,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                           ,0x94,(char *)CONCAT71(query_select_dataset_with_criteria3.m_query_string
                                                  ._M_dataplus._M_p._1_7_,
                                                  (char)query_select_dataset_with_criteria3.
                                                        m_query_string._M_dataplus._M_p));
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&filter2,(Message *)&gtest_ar__11);
                goto LAB_00110df5;
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar__5.message_);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&query_select_dataset_with_criteria3,"employee_name",
                         (allocator<char> *)&gtest_ar__5);
              __l_02._M_len = 1;
              __l_02._M_array = &query_select_dataset_with_criteria3.m_query_string;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&expected_dataset2,__l_02,(allocator_type *)&gtest_ar__11);
              std::__cxx11::string::~string((string *)&query_select_dataset_with_criteria3);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&query_select_dataset_with_criteria3,
                       &query_select_dataset_with_criteria2.m_dataset);
              gtest_ar__5.success_ =
                   std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&query_select_dataset_with_criteria3,&expected_dataset2);
              gtest_ar__5.message_.ptr_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&query_select_dataset_with_criteria3);
              if (gtest_ar__5.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar__11);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&query_select_dataset_with_criteria3.m_query_string,
                           (internal *)&gtest_ar__5,
                           (AssertionResult *)
                           "query_select_dataset_with_criteria2.dataset() == expected_dataset2",
                           "false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&filter2,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                           ,0x96,(char *)CONCAT71(query_select_dataset_with_criteria3.m_query_string
                                                  ._M_dataplus._M_p._1_7_,
                                                  (char)query_select_dataset_with_criteria3.
                                                        m_query_string._M_dataplus._M_p));
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&filter2,(Message *)&gtest_ar__11);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&filter2);
                std::__cxx11::string::~string((string *)&query_select_dataset_with_criteria3);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&gtest_ar__11);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr(&gtest_ar__5.message_);
              }
              else {
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr(&gtest_ar__5.message_);
                local_408.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
                ::pair<const_char_(&)[9],_database::ComparisonType,_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
                            *)&gtest_ar__5,(char (*) [9])"fulltime",(ComparisonType *)&local_408);
                __l_03._M_len = 1;
                __l_03._M_array = (iterator)&gtest_ar__5;
                std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                          *)&filter3,__l_03,(allocator_type *)&local_3bc);
                std::
                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
                ::pair<const_char_(&)[16],_true>
                          ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
                            *)&query_select_dataset_with_criteria3,(char (*) [16])"employee_status",
                           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                            *)&filter3);
                local_440.data_._0_4_ = 1;
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
                ::pair<const_char_(&)[6],_database::ComparisonType,_true>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
                            *)&gtest_ar__11,(char (*) [6])0x131056,(ComparisonType *)&local_440);
                __l_04._M_len = 1;
                __l_04._M_array = (iterator)&gtest_ar__11;
                std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                          *)&expected_dataset3,__l_04,&local_4f1);
                std::
                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
                ::pair<const_char_(&)[20],_true>
                          ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
                            *)&query_select_dataset_with_criteria3.m_database_name.field_2,
                           (char (*) [20])"employee_department",
                           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                            *)&expected_dataset3);
                __l_05._M_len = 2;
                __l_05._M_array = (iterator)&query_select_dataset_with_criteria3;
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                ::map(&filter2,__l_05,&local_4f2,&local_4f3);
                lVar3 = 0x38;
                do {
                  std::
                  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
                  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
                           *)((long)&query_select_dataset_with_criteria3.m_query_string._M_dataplus.
                                     _M_p + lVar3));
                  lVar3 = lVar3 + -0x38;
                } while (lVar3 != -0x38);
                std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                           *)&expected_dataset3);
                std::__cxx11::string::~string((string *)&gtest_ar__11);
                std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                           *)&filter3);
                std::__cxx11::string::~string((string *)&gtest_ar__5);
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                            *)&query_select_dataset_with_criteria3,
                           &query_select_dataset_with_criteria2.m_filter._M_t);
                gtest_ar__5.success_ =
                     std::operator==((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                                      *)&query_select_dataset_with_criteria3,&filter2._M_t);
                gtest_ar__5.message_.ptr_ =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                             *)&query_select_dataset_with_criteria3);
                if (gtest_ar__5.success_ == false) {
                  testing::Message::Message((Message *)&gtest_ar__11);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&query_select_dataset_with_criteria3.m_query_string,
                             (internal *)&gtest_ar__5,
                             (AssertionResult *)
                             "query_select_dataset_with_criteria2.filter() == filter2","false",
                             "true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&filter3,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                             ,0x9b,(char *)CONCAT71(query_select_dataset_with_criteria3.
                                                    m_query_string._M_dataplus._M_p._1_7_,
                                                    (char)query_select_dataset_with_criteria3.
                                                          m_query_string._M_dataplus._M_p));
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&filter3,(Message *)&gtest_ar__11);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&filter3);
                  std::__cxx11::string::~string((string *)&query_select_dataset_with_criteria3);
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&gtest_ar__11);
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr(&gtest_ar__5.message_);
                }
                else {
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr(&gtest_ar__5.message_);
                  database::Query::Query
                            (&query_select_dataset_with_criteria3,
                             "select employee_id,employee_name,employee_status from company.employee where employee_join_date >= 20170912 and employee_join_date <= 20180101"
                            );
                  gtest_ar__11.message_.ptr_ =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                  gtest_ar__11.success_ =
                       query_select_dataset_with_criteria3.m_transaction_type == select_dataset;
                  if (query_select_dataset_with_criteria3.m_transaction_type == select_dataset) {
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~scoped_ptr(&gtest_ar__11.message_);
                    gtest_ar__11.message_.ptr_ =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                    gtest_ar__11.success_ =
                         query_select_dataset_with_criteria3.m_transaction_metatype == dml;
                    if (query_select_dataset_with_criteria3.m_transaction_metatype != dml) {
                      testing::Message::Message((Message *)&filter3);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)&gtest_ar__5,(internal *)&gtest_ar__11,
                                 (AssertionResult *)
                                 "query_select_dataset_with_criteria3.transactionMetaType() == database::dml"
                                 ,"false","true",in_R9);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&expected_dataset3,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                                 ,0x9f,(char *)CONCAT71(gtest_ar__5._1_7_,gtest_ar__5.success_));
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&expected_dataset3,(Message *)&filter3);
                      goto LAB_0011110d;
                    }
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~scoped_ptr(&gtest_ar__11.message_);
                    std::__cxx11::string::string
                              ((string *)&gtest_ar__5,
                               (string *)&query_select_dataset_with_criteria3.m_database_name);
                    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&gtest_ar__5,"company");
                    gtest_ar__11.success_ = bVar2;
                    gtest_ar__11.message_.ptr_ =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                    std::__cxx11::string::~string((string *)&gtest_ar__5);
                    if (gtest_ar__11.success_ == false) {
                      testing::Message::Message((Message *)&filter3);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)&gtest_ar__5,(internal *)&gtest_ar__11,
                                 (AssertionResult *)
                                 "query_select_dataset_with_criteria3.databaseName() == \"company\""
                                 ,"false","true",in_R9);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&expected_dataset3,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                                 ,0xa0,(char *)CONCAT71(gtest_ar__5._1_7_,gtest_ar__5.success_));
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&expected_dataset3,(Message *)&filter3);
                      goto LAB_0011110d;
                    }
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~scoped_ptr(&gtest_ar__11.message_);
                    std::__cxx11::string::string
                              ((string *)&gtest_ar__5,
                               (string *)&query_select_dataset_with_criteria3.m_container_name);
                    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&gtest_ar__5,"employee");
                    gtest_ar__11.success_ = bVar2;
                    gtest_ar__11.message_.ptr_ =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                    std::__cxx11::string::~string((string *)&gtest_ar__5);
                    if (gtest_ar__11.success_ == false) {
                      testing::Message::Message((Message *)&filter3);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)&gtest_ar__5,(internal *)&gtest_ar__11,
                                 (AssertionResult *)
                                 "query_select_dataset_with_criteria3.containerName() == \"employee\""
                                 ,"false","true",in_R9);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&expected_dataset3,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                                 ,0xa1,(char *)CONCAT71(gtest_ar__5._1_7_,gtest_ar__5.success_));
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&expected_dataset3,(Message *)&filter3);
                      goto LAB_0011110d;
                    }
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~scoped_ptr(&gtest_ar__11.message_);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&gtest_ar__5,"employee_id",(allocator<char> *)&gtest_ar__11
                              );
                    std::__cxx11::string::string<std::allocator<char>>
                              (local_480,"employee_name",(allocator<char> *)&filter3);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)(local_478 + 0x18),"employee_status",
                               (allocator<char> *)&local_408);
                    __l_06._M_len = 3;
                    __l_06._M_array = (iterator)&gtest_ar__5;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::vector(&expected_dataset3,__l_06,(allocator_type *)&local_440);
                    lVar3 = 0x40;
                    do {
                      std::__cxx11::string::~string((string *)(&gtest_ar__5.success_ + lVar3));
                      lVar3 = lVar3 + -0x20;
                    } while (lVar3 != -0x20);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&gtest_ar__5,&query_select_dataset_with_criteria3.m_dataset);
                    bVar2 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)&gtest_ar__5,&expected_dataset3);
                    gtest_ar__11.success_ = bVar2;
                    gtest_ar__11.message_.ptr_ =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&gtest_ar__5);
                    if (gtest_ar__11.success_ == false) {
                      testing::Message::Message((Message *)&filter3);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)&gtest_ar__5,(internal *)&gtest_ar__11,
                                 (AssertionResult *)
                                 "query_select_dataset_with_criteria3.dataset() == expected_dataset3"
                                 ,"false","true",in_R9);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&local_408,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                                 ,0xa3,(char *)CONCAT71(gtest_ar__5._1_7_,gtest_ar__5.success_));
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&local_408,(Message *)&filter3);
                      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_408);
                      std::__cxx11::string::~string((string *)&gtest_ar__5);
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&filter3);
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~scoped_ptr(&gtest_ar__11.message_);
                    }
                    else {
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~scoped_ptr(&gtest_ar__11.message_);
                      local_440.data_._0_4_ = 2;
                      std::
                      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
                      ::pair<const_char_(&)[9],_database::ComparisonType,_true>
                                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
                                  *)&gtest_ar__5,(char (*) [9])"20170912",
                                 (ComparisonType *)&local_440);
                      local_3bc = lesser_or_equal_to;
                      std::
                      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
                      ::pair<const_char_(&)[9],_database::ComparisonType,_true>
                                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>
                                  *)local_478,(char (*) [9])0x131290,&local_3bc);
                      __l_07._M_len = 2;
                      __l_07._M_array = (iterator)&gtest_ar__5;
                      std::
                      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                      ::vector(&local_408,__l_07,&local_4f1);
                      std::
                      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
                      ::pair<const_char_(&)[19],_true>
                                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
                                  *)&gtest_ar__11,(char (*) [19])"employee_join_date",&local_408);
                      __l_08._M_len = 1;
                      __l_08._M_array = (iterator)&gtest_ar__11;
                      std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                      ::map(&filter3,__l_08,&local_4f2,&local_4f3);
                      std::
                      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
                      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>
                               *)&gtest_ar__11);
                      std::
                      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>
                      ::~vector(&local_408);
                      lVar3 = 0x28;
                      do {
                        std::__cxx11::string::~string((string *)(&gtest_ar__5.success_ + lVar3));
                        lVar3 = lVar3 + -0x28;
                      } while (lVar3 != -0x28);
                      std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                                  *)&gtest_ar__5,&query_select_dataset_with_criteria3.m_filter._M_t)
                      ;
                      bVar2 = std::operator==((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                                               *)&gtest_ar__5,&filter3._M_t);
                      gtest_ar__11.success_ = bVar2;
                      gtest_ar__11.message_.ptr_ =
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                      std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                                   *)&gtest_ar__5);
                      if (gtest_ar__11.success_ == false) {
                        testing::Message::Message((Message *)&local_408);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&gtest_ar__5,(internal *)&gtest_ar__11,
                                   (AssertionResult *)
                                   "query_select_dataset_with_criteria3.filter() == filter3","false"
                                   ,"true",in_R9);
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_440,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                                   ,0xa7,(char *)CONCAT71(gtest_ar__5._1_7_,gtest_ar__5.success_));
                        testing::internal::AssertHelper::operator=(&local_440,(Message *)&local_408)
                        ;
                        testing::internal::AssertHelper::~AssertHelper(&local_440);
                        std::__cxx11::string::~string((string *)&gtest_ar__5);
                        testing::internal::
                        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)&local_408);
                      }
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~scoped_ptr(&gtest_ar__11.message_);
                      std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                      ::~_Rb_tree(&filter3._M_t);
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&expected_dataset3);
                  }
                  else {
                    testing::Message::Message((Message *)&filter3);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar__5,(internal *)&gtest_ar__11,
                               (AssertionResult *)
                               "query_select_dataset_with_criteria3.transactionType() == database::select_dataset"
                               ,"false","true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&expected_dataset3,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                               ,0x9e,(char *)CONCAT71(gtest_ar__5._1_7_,gtest_ar__5.success_));
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&expected_dataset3,(Message *)&filter3);
LAB_0011110d:
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&expected_dataset3);
                    std::__cxx11::string::~string((string *)&gtest_ar__5);
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&filter3);
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~scoped_ptr(&gtest_ar__11.message_);
                  }
                  database::Query::~Query(&query_select_dataset_with_criteria3);
                }
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
                ::~_Rb_tree(&filter2._M_t);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&expected_dataset2);
            }
            else {
              testing::Message::Message((Message *)&gtest_ar__11);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&query_select_dataset_with_criteria3.m_query_string,
                         (internal *)&gtest_ar__5,
                         (AssertionResult *)
                         "query_select_dataset_with_criteria2.transactionType() == database::select_dataset"
                         ,"false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&filter2,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                         ,0x91,(char *)CONCAT71(query_select_dataset_with_criteria3.m_query_string.
                                                _M_dataplus._M_p._1_7_,
                                                (char)query_select_dataset_with_criteria3.
                                                      m_query_string._M_dataplus._M_p));
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&filter2,(Message *)&gtest_ar__11);
LAB_00110df5:
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&filter2);
              std::__cxx11::string::~string((string *)&query_select_dataset_with_criteria3);
              testing::internal::
              scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&gtest_ar__11);
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar__5.message_);
            }
            database::Query::~Query(&query_select_dataset_with_criteria2);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::ComparisonType>_>_>_>_>_>
          ::~_Rb_tree(&filter1._M_t);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&expected_dataset1);
        goto LAB_00110b0c;
      }
      testing::Message::Message((Message *)&gtest_ar__5);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&query_select_dataset_with_criteria2.m_query_string,
                 (internal *)&query_select_dataset_with_criteria3,
                 (AssertionResult *)
                 "query_select_dataset_with_criteria1.containerName() == \"employee\"","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__11,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                 ,0x88,query_select_dataset_with_criteria2.m_query_string._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar__11,(Message *)&gtest_ar__5);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar__5);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&query_select_dataset_with_criteria2.m_query_string,
               (internal *)&query_select_dataset_with_criteria3,
               (AssertionResult *)
               "query_select_dataset_with_criteria1.transactionMetaType() == database::dml","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__11,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
               ,0x86,query_select_dataset_with_criteria2.m_query_string._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar__11,(Message *)&gtest_ar__5);
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__11);
  std::__cxx11::string::~string((string *)&query_select_dataset_with_criteria2);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar__5);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&query_select_dataset_with_criteria3.m_query_string._M_string_length);
LAB_00110b0c:
  database::Query::~Query(&query_select_dataset_with_criteria1);
  return;
}

Assistant:

TEST(QueryTests_SelectDataSetWithCriteria,canDetermineSpecificationForSelectDataSetWithCriteria)
{
  database::Query query_select_dataset_with_criteria1 = "select employee_id,employee_name from company.employee where employee_id = 1";
  ASSERT_TRUE(query_select_dataset_with_criteria1.transactionMetaType() == database::dml);
  ASSERT_TRUE(query_select_dataset_with_criteria1.databaseName() == "company");
  ASSERT_TRUE(query_select_dataset_with_criteria1.containerName() == "employee");
  std::vector<std::string> expected_dataset1 = {"employee_id","employee_name"};
  ASSERT_TRUE(query_select_dataset_with_criteria1.dataset() == expected_dataset1);
  database::api_filter_type filter1 = {
    {"employee_id",{{"1",database::equal_to}}}
  };
  ASSERT_TRUE(query_select_dataset_with_criteria1.filter() == filter1);

  database::Query query_select_dataset_with_criteria2 = "select employee_name from company.employee where employee_status = fulltime and employee_department <> sales";
  ASSERT_TRUE(query_select_dataset_with_criteria2.transactionType() == database::select_dataset);
  ASSERT_TRUE(query_select_dataset_with_criteria2.transactionMetaType() == database::dml);
  ASSERT_TRUE(query_select_dataset_with_criteria2.databaseName() == "company");
  ASSERT_TRUE(query_select_dataset_with_criteria2.containerName() == "employee");
  std::vector<std::string> expected_dataset2 = {"employee_name"};
  ASSERT_TRUE(query_select_dataset_with_criteria2.dataset() == expected_dataset2);
  database::api_filter_type filter2 = {
    {"employee_status",{{"fulltime",database::equal_to}}},
    {"employee_department",{{"sales",database::not_equal_to}}}
  };
  ASSERT_TRUE(query_select_dataset_with_criteria2.filter() == filter2);

  database::Query query_select_dataset_with_criteria3 = "select employee_id,employee_name,employee_status from company.employee where employee_join_date >= 20170912 and employee_join_date <= 20180101";
  ASSERT_TRUE(query_select_dataset_with_criteria3.transactionType() == database::select_dataset);
  ASSERT_TRUE(query_select_dataset_with_criteria3.transactionMetaType() == database::dml);
  ASSERT_TRUE(query_select_dataset_with_criteria3.databaseName() == "company");
  ASSERT_TRUE(query_select_dataset_with_criteria3.containerName() == "employee");
  std::vector<std::string> expected_dataset3 = {"employee_id","employee_name","employee_status"};
  ASSERT_TRUE(query_select_dataset_with_criteria3.dataset() == expected_dataset3);
  database::api_filter_type filter3 = {
    {"employee_join_date",{{"20170912",database::greater_or_equal_to},{"20180101",database::lesser_or_equal_to}}}
  };
  ASSERT_TRUE(query_select_dataset_with_criteria3.filter() == filter3);
}